

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationOperation.cpp
# Opt level: O3

MovePtr<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_> *
__thiscall
vkt::synchronization::anon_unknown_0::VertexInput::Support::build
          (MovePtr<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
           *__return_storage_ptr__,Support *this,OperationContext *context,Resource *resource)

{
  Operation *pOVar1;
  VkExtent3D *extent;
  undefined1 (*pauVar2) [12];
  DeviceInterface *pDVar3;
  VkDevice pVVar4;
  _func_int *p_Var5;
  Allocation *pAVar6;
  VkImageSubresourceRange subresourceRange;
  Handle<(vk::HandleType)13> HVar7;
  DeviceInterface *pDVar8;
  VkDevice pVVar9;
  VkAllocationCallbacks *pVVar10;
  Handle<(vk::HandleType)18> HVar11;
  UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>
  *pUVar12;
  UniqueBase<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_> *pUVar13
  ;
  Operation *pOVar14;
  deUint32 stride;
  Operation *pOVar15;
  Buffer *this_00;
  DescriptorSetLayoutBuilder *this_01;
  DescriptorPoolBuilder *this_02;
  DescriptorSetUpdateBuilder *this_03;
  Image *this_04;
  TextureFormat format;
  GraphicsPipelineBuilder *pGVar16;
  const_iterator cVar17;
  VkDescriptorBufferInfo outputBufferDescriptorInfo;
  Move<vk::Handle<(vk::HandleType)13>_> local_268;
  Move<vk::Handle<(vk::HandleType)18>_> local_248;
  Operation *local_228;
  Operation *local_220;
  Operation *local_218;
  UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>
  *local_210;
  Operation *local_208;
  Operation *local_200;
  OperationContext *local_1f8;
  Operation *local_1f0;
  UniqueBase<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_>
  *local_1e8;
  Operation *local_1e0;
  Allocator *local_1d8;
  _func_int *local_1d0;
  Operation *local_1c8;
  MovePtr<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
  *local_1c0;
  GraphicsPipelineBuilder local_1b8;
  undefined8 local_a8;
  undefined8 uStack_a0;
  deUint32 local_98;
  key_type local_88;
  key_type local_68;
  deUint64 local_48;
  undefined8 local_40;
  _func_int *local_38;
  
  local_1c0 = __return_storage_ptr__;
  pOVar15 = (Operation *)operator_new(0x180);
  pOVar15->_vptr_Operation = (_func_int **)&PTR__Implementation_00d02620;
  pOVar15[1]._vptr_Operation = (_func_int **)context;
  pOVar15[2]._vptr_Operation = (_func_int **)resource;
  local_210 = (UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>
               *)(pOVar15 + 3);
  pOVar15[3]._vptr_Operation = (_func_int **)0x0;
  pOVar15[5]._vptr_Operation = (_func_int **)0x0;
  pOVar15[7]._vptr_Operation = (_func_int **)0x0;
  local_218 = pOVar15 + 9;
  local_208 = pOVar15 + 0xd;
  local_220 = pOVar15 + 0x11;
  local_1f0 = pOVar15 + 0x15;
  local_1e8 = (UniqueBase<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_>
               *)(pOVar15 + 0x1a);
  pOVar15[0x1a]._vptr_Operation = (_func_int **)0x0;
  local_200 = pOVar15 + 0x1c;
  pOVar15[0x1c]._vptr_Operation = (_func_int **)0x0;
  pOVar15[0x1d]._vptr_Operation = (_func_int **)0x0;
  pOVar15[0x1e]._vptr_Operation = (_func_int **)0x0;
  pOVar15[0x1f]._vptr_Operation = (_func_int **)0x0;
  pOVar1 = pOVar15 + 0x24;
  local_228 = pOVar15 + 0x28;
  local_1e0 = pOVar15 + 0x2c;
  pOVar15[9]._vptr_Operation = (_func_int **)0x0;
  pOVar15[10]._vptr_Operation = (_func_int **)0x0;
  pOVar15[0xb]._vptr_Operation = (_func_int **)0x0;
  pOVar15[0xc]._vptr_Operation = (_func_int **)0x0;
  pOVar15[0xd]._vptr_Operation = (_func_int **)0x0;
  pOVar15[0xe]._vptr_Operation = (_func_int **)0x0;
  pOVar15[0xf]._vptr_Operation = (_func_int **)0x0;
  pOVar15[0x10]._vptr_Operation = (_func_int **)0x0;
  pOVar15[0x11]._vptr_Operation = (_func_int **)0x0;
  pOVar15[0x12]._vptr_Operation = (_func_int **)0x0;
  pOVar15[0x13]._vptr_Operation = (_func_int **)0x0;
  pOVar15[0x14]._vptr_Operation = (_func_int **)0x0;
  pOVar15[0x15]._vptr_Operation = (_func_int **)0x0;
  pOVar15[0x16]._vptr_Operation = (_func_int **)0x0;
  pOVar15[0x17]._vptr_Operation = (_func_int **)0x0;
  pOVar15[0x18]._vptr_Operation = (_func_int **)0x0;
  pOVar15[0x24]._vptr_Operation = (_func_int **)0x0;
  pOVar15[0x25]._vptr_Operation = (_func_int **)0x0;
  pOVar15[0x26]._vptr_Operation = (_func_int **)0x0;
  pOVar15[0x27]._vptr_Operation = (_func_int **)0x0;
  pOVar15[0x28]._vptr_Operation = (_func_int **)0x0;
  pOVar15[0x29]._vptr_Operation = (_func_int **)0x0;
  pOVar15[0x2a]._vptr_Operation = (_func_int **)0x0;
  pOVar15[0x2b]._vptr_Operation = (_func_int **)0x0;
  pOVar15[0x2c]._vptr_Operation = (_func_int **)0x0;
  pOVar15[0x2d]._vptr_Operation = (_func_int **)0x0;
  pOVar15[0x2e]._vptr_Operation = (_func_int **)0x0;
  pOVar15[0x2f]._vptr_Operation = (_func_int **)0x0;
  local_1c8 = pOVar1;
  requireFeatures(context->m_vki,context->m_physicalDevice,8);
  pDVar3 = context->m_vk;
  pVVar4 = context->m_device;
  local_1d8 = context->m_allocator;
  p_Var5 = pOVar15[2]._vptr_Operation[5];
  local_1f8 = context;
  this_00 = (Buffer *)operator_new(0x30);
  local_1d0 = p_Var5;
  makeBufferCreateInfo((VkBufferCreateInfo *)&local_1b8,(VkDeviceSize)p_Var5,0x20);
  synchronization::Buffer::Buffer
            (this_00,pDVar3,pVVar4,local_1d8,(VkBufferCreateInfo *)&local_1b8,(MemoryRequirement)0x1
            );
  pUVar12 = local_210;
  local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal = 0;
  if ((local_210->m_data).ptr != this_00) {
    de::details::
    UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>::
    reset(local_210);
    (pUVar12->m_data).ptr = this_00;
  }
  de::details::
  UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>::reset
            ((UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>
              *)&local_268);
  p_Var5 = local_1d0;
  pAVar6 = (((local_210->m_data).ptr)->m_allocation).
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  memset(pAVar6->m_hostPtr,0,(size_t)local_1d0);
  ::vk::flushMappedMemoryRange
            (pDVar3,pVVar4,(VkDeviceMemory)(pAVar6->m_memory).m_internal,pAVar6->m_offset,
             (VkDeviceSize)p_Var5);
  pOVar14 = local_1e0;
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)&local_1b8);
  this_01 = ::vk::DescriptorSetLayoutBuilder::addBinding
                      ((DescriptorSetLayoutBuilder *)&local_1b8,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1,
                       1,(VkSampler *)0x0);
  ::vk::DescriptorSetLayoutBuilder::build
            ((Move<vk::Handle<(vk::HandleType)19>_> *)&local_248,this_01,pDVar3,pVVar4,0);
  pVVar10 = local_248.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator;
  pVVar9 = local_248.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device;
  pDVar8 = local_248.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface;
  HVar11.m_internal =
       local_248.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal;
  local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device =
       local_248.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device;
  local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator =
       local_248.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator;
  local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal =
       local_248.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal;
  local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface =
       local_248.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface;
  local_248.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal = 0;
  local_248.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_248.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_248.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  if (local_228->_vptr_Operation == (_func_int **)0x0) {
    local_228[2]._vptr_Operation = (_func_int **)pVVar9;
    local_228[3]._vptr_Operation = (_func_int **)pVVar10;
    local_228->_vptr_Operation = (_func_int **)HVar11.m_internal;
    local_228[1]._vptr_Operation = (_func_int **)pDVar8;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)19>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)19>_> *)(pOVar15 + 0x29),
               (VkDescriptorSetLayout)local_228->_vptr_Operation);
    local_228[2]._vptr_Operation =
         (_func_int **)
         local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device;
    local_228[3]._vptr_Operation =
         (_func_int **)
         local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator;
    local_228->_vptr_Operation =
         (_func_int **)
         local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal;
    local_228[1]._vptr_Operation =
         (_func_int **)
         local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface;
    if (local_248.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)19>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)19>_> *)
                 &local_248.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter,
                 (VkDescriptorSetLayout)
                 local_248.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal);
    }
  }
  local_248.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_248.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  local_248.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal = 0;
  local_248.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  if (local_1b8.m_fragmentShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter
      .m_deviceIface != (DeviceInterface *)0x0) {
    operator_delete(local_1b8.m_fragmentShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.
                    m_data.deleter.m_deviceIface,
                    (long)local_1b8.m_fragmentShaderModule.
                          super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator
                    - (long)local_1b8.m_fragmentShaderModule.
                            super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
                            m_deviceIface);
  }
  if (local_1b8.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
      m_device != (VkDevice)0x0) {
    operator_delete(local_1b8.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.
                    m_data.deleter.m_device,
                    local_1b8.m_fragmentShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.
                    m_data.object.m_internal -
                    (long)local_1b8.m_vertexShaderModule.
                          super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_device);
  }
  if (local_1b8.m_renderSize.m_data != (int  [2])0x0) {
    operator_delete((void *)local_1b8.m_renderSize.m_data,
                    (long)local_1b8.m_vertexShaderModule.
                          super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
                          m_deviceIface - (long)local_1b8.m_renderSize.m_data);
  }
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder((DescriptorPoolBuilder *)&local_248);
  this_02 = ::vk::DescriptorPoolBuilder::addType
                      ((DescriptorPoolBuilder *)&local_248,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1);
  ::vk::DescriptorPoolBuilder::build
            ((Move<vk::Handle<(vk::HandleType)21>_> *)&local_268,this_02,pDVar3,pVVar4,1,1);
  pVVar10 = local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator;
  pVVar9 = local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device;
  pDVar8 = local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface;
  HVar7.m_internal =
       local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal;
  local_1b8.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
  m_deviceIface =
       (DeviceInterface *)
       local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device;
  local_1b8.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
  m_device = (VkDevice)
             local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator;
  local_1b8.m_renderSize.m_data[0] =
       (undefined4)local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal
  ;
  local_1b8.m_renderSize.m_data[1] =
       local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal._4_4_;
  local_1b8.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
  m_internal = (deUint64)
               local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface
  ;
  local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal = 0;
  local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  if (pOVar1->_vptr_Operation == (_func_int **)0x0) {
    pOVar15[0x26]._vptr_Operation = (_func_int **)pVVar9;
    pOVar15[0x27]._vptr_Operation = (_func_int **)pVVar10;
    pOVar1->_vptr_Operation = (_func_int **)HVar7.m_internal;
    pOVar15[0x25]._vptr_Operation = (_func_int **)pDVar8;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)21>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)21>_> *)(pOVar15 + 0x25),
               (VkDescriptorPool)pOVar1->_vptr_Operation);
    pOVar15[0x26]._vptr_Operation =
         (_func_int **)
         local_1b8.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.
         deleter.m_deviceIface;
    pOVar15[0x27]._vptr_Operation =
         (_func_int **)
         local_1b8.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.
         deleter.m_device;
    pOVar1->_vptr_Operation = (_func_int **)local_1b8.m_renderSize.m_data;
    pOVar15[0x25]._vptr_Operation =
         (_func_int **)
         local_1b8.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object
         .m_internal;
    if (local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)21>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)21>_> *)
                 &local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter,
                 (VkDescriptorPool)
                 local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal);
    }
  }
  local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal._0_4_ = 0;
  local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal._4_4_ = 0;
  local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  if ((_func_int **)
      local_248.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal !=
      (_func_int **)0x0) {
    operator_delete((void *)local_248.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.
                            m_internal,
                    (long)local_248.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.
                          m_device -
                    local_248.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.
                    m_internal);
  }
  makeDescriptorSet((Move<vk::Handle<(vk::HandleType)22>_> *)&local_268,pDVar3,pVVar4,
                    (VkDescriptorPool)pOVar1->_vptr_Operation,
                    (VkDescriptorSetLayout)local_228->_vptr_Operation);
  pVVar10 = local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator;
  pVVar9 = local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device;
  pDVar8 = local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface;
  HVar7.m_internal =
       local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal;
  local_1b8.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
  m_deviceIface =
       (DeviceInterface *)
       local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device;
  local_1b8.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
  m_device = (VkDevice)
             local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator;
  local_1b8.m_renderSize.m_data[0] =
       (undefined4)local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal
  ;
  local_1b8.m_renderSize.m_data[1] =
       local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal._4_4_;
  local_1b8.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
  m_internal = (deUint64)
               local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface
  ;
  local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal._0_4_ = 0;
  local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal._4_4_ = 0;
  local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  if (pOVar14->_vptr_Operation == (_func_int **)0x0) {
    pOVar14[2]._vptr_Operation = (_func_int **)pVVar9;
    pOVar14[3]._vptr_Operation = (_func_int **)pVVar10;
    pOVar14->_vptr_Operation = (_func_int **)HVar7.m_internal;
    pOVar14[1]._vptr_Operation = (_func_int **)pDVar8;
  }
  else {
    local_248.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal =
         (deUint64)pOVar14->_vptr_Operation;
    (**(code **)(*pOVar15[0x2d]._vptr_Operation + 0x1e8))
              (pOVar15[0x2d]._vptr_Operation,pOVar15[0x2e]._vptr_Operation,
               pOVar15[0x2f]._vptr_Operation,1);
    *(undefined4 *)&pOVar14[2]._vptr_Operation =
         local_1b8.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.
         deleter.m_deviceIface._0_4_;
    *(undefined4 *)((long)&pOVar14[2]._vptr_Operation + 4) =
         local_1b8.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.
         deleter.m_deviceIface._4_4_;
    *(undefined4 *)&pOVar14[3]._vptr_Operation =
         local_1b8.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.
         deleter.m_device._0_4_;
    *(undefined4 *)((long)&pOVar14[3]._vptr_Operation + 4) =
         local_1b8.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.
         deleter.m_device._4_4_;
    *(int *)&pOVar14->_vptr_Operation = local_1b8.m_renderSize.m_data[0];
    *(int *)((long)&pOVar14->_vptr_Operation + 4) = local_1b8.m_renderSize.m_data[1];
    *(undefined4 *)&pOVar14[1]._vptr_Operation =
         (undefined4)
         local_1b8.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object
         .m_internal;
    *(undefined4 *)((long)&pOVar14[1]._vptr_Operation + 4) =
         local_1b8.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object
         .m_internal._4_4_;
    if ((int  [2])local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal
        != (int  [2])0x0) {
      local_1b8.m_renderSize.m_data[0] =
           (undefined4)
           local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal;
      local_1b8.m_renderSize.m_data[1] =
           local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal._4_4_;
      (*(local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface)->
        _vptr_DeviceInterface[0x3d])
                (local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
                 m_deviceIface,
                 local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device,
                 local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator
                 ,1);
    }
  }
  local_48 = (((local_210->m_data).ptr)->m_buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.
             m_data.object.m_internal;
  local_40 = 0;
  local_38 = local_1d0;
  ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder
            ((DescriptorSetUpdateBuilder *)&local_1b8);
  this_03 = (DescriptorSetUpdateBuilder *)
            ::vk::DescriptorSetUpdateBuilder::write
                      ((DescriptorSetUpdateBuilder *)&local_1b8,(int)pOVar14->_vptr_Operation,
                       (void *)0x0,0);
  ::vk::DescriptorSetUpdateBuilder::update(this_03,pDVar3,pVVar4);
  if (local_1b8.m_fragmentShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter
      .m_deviceIface != (DeviceInterface *)0x0) {
    operator_delete(local_1b8.m_fragmentShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.
                    m_data.deleter.m_deviceIface,
                    (long)local_1b8.m_fragmentShaderModule.
                          super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator
                    - (long)local_1b8.m_fragmentShaderModule.
                            super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
                            m_deviceIface);
  }
  if ((VkAllocationCallbacks *)
      local_1b8.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
      m_device != (VkAllocationCallbacks *)0x0) {
    operator_delete(local_1b8.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.
                    m_data.deleter.m_device,
                    local_1b8.m_fragmentShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.
                    m_data.object.m_internal -
                    (long)local_1b8.m_vertexShaderModule.
                          super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_device);
  }
  std::
  vector<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
  ::~vector((vector<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
             *)&local_1b8);
  *(undefined4 *)&pOVar15[0x19]._vptr_Operation = 0x25;
  *(undefined8 *)((long)&pOVar15[0x21]._vptr_Operation + 4) = 1;
  *(undefined8 *)((long)&pOVar15[0x22]._vptr_Operation + 4) = 1;
  *(undefined4 *)((long)&pOVar15[0x23]._vptr_Operation + 4) = 1;
  pOVar15[0x20]._vptr_Operation = (_func_int **)0x1000000010;
  *(undefined4 *)&pOVar15[0x21]._vptr_Operation = 1;
  this_04 = (Image *)operator_new(0x30);
  extent = (VkExtent3D *)(pOVar15 + 0x20);
  makeImageCreateInfo((VkImageCreateInfo *)&local_1b8,VK_IMAGE_TYPE_2D,extent,
                      VK_FORMAT_R8G8B8A8_UNORM,0x10);
  synchronization::Image::Image
            (this_04,pDVar3,pVVar4,local_1d8,(VkImageCreateInfo *)&local_1b8,(MemoryRequirement)0x0)
  ;
  pUVar13 = local_1e8;
  local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal._0_4_ = 0;
  local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal._4_4_ = 0;
  if ((local_1e8->m_data).ptr != this_04) {
    de::details::
    UniqueBase<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_>::reset
              (local_1e8);
    (pUVar13->m_data).ptr = this_04;
  }
  de::details::
  UniqueBase<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_>::reset
            ((UniqueBase<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_>
              *)&local_268);
  pauVar2 = (undefined1 (*) [12])((long)&pOVar15[0x21]._vptr_Operation + 4);
  local_98 = *(deUint32 *)((long)&pOVar15[0x23]._vptr_Operation + 4);
  local_a8 = *(undefined8 *)*pauVar2;
  uStack_a0 = *(undefined8 *)((long)&pOVar15[0x22]._vptr_Operation + 4);
  subresourceRange.baseArrayLayer = (int)((ulong)uStack_a0 >> 0x20);
  subresourceRange._0_12_ = *pauVar2;
  subresourceRange.layerCount = local_98;
  makeImageView(&local_268,pDVar3,pVVar4,(VkImage)*pOVar15[0x1a]._vptr_Operation,
                VK_IMAGE_VIEW_TYPE_2D,*(VkFormat *)&pOVar15[0x19]._vptr_Operation,subresourceRange);
  pVVar10 = local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator;
  pVVar9 = local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device;
  pDVar8 = local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface;
  HVar7.m_internal =
       local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal;
  local_1b8.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
  m_deviceIface =
       (DeviceInterface *)
       local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device;
  local_1b8.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
  m_device = (VkDevice)
             local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator;
  local_1b8.m_renderSize.m_data[0] =
       (undefined4)local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal
  ;
  local_1b8.m_renderSize.m_data[1] =
       local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal._4_4_;
  local_1b8.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
  m_internal = (deUint64)
               local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface
  ;
  local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal._0_4_ = 0;
  local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal._4_4_ = 0;
  local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  if (local_200->_vptr_Operation == (_func_int **)0x0) {
    local_200[2]._vptr_Operation = (_func_int **)pVVar9;
    local_200[3]._vptr_Operation = (_func_int **)pVVar10;
    local_200->_vptr_Operation = (_func_int **)HVar7.m_internal;
    local_200[1]._vptr_Operation = (_func_int **)pDVar8;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)13>_> *)(pOVar15 + 0x1d),
               (VkImageView)local_200->_vptr_Operation);
    local_200[2]._vptr_Operation =
         (_func_int **)
         local_1b8.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.
         deleter.m_deviceIface;
    local_200[3]._vptr_Operation =
         (_func_int **)
         local_1b8.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.
         deleter.m_device;
    local_200->_vptr_Operation = (_func_int **)local_1b8.m_renderSize.m_data;
    local_200[1]._vptr_Operation =
         (_func_int **)
         local_1b8.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object
         .m_internal;
    if (local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
                (&local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter,
                 (VkImageView)
                 local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal);
    }
  }
  makeRenderPass((Move<vk::Handle<(vk::HandleType)17>_> *)&local_268,pDVar3,pVVar4,
                 *(VkFormat *)&pOVar15[0x19]._vptr_Operation);
  pVVar10 = local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator;
  pVVar9 = local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device;
  pDVar8 = local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface;
  HVar7.m_internal =
       local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal;
  local_1b8.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
  m_deviceIface =
       (DeviceInterface *)
       local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device;
  local_1b8.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
  m_device = (VkDevice)
             local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator;
  local_1b8.m_renderSize.m_data[0] =
       (undefined4)local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal
  ;
  local_1b8.m_renderSize.m_data[1] =
       local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal._4_4_;
  local_1b8.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
  m_internal = (deUint64)
               local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface
  ;
  local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal._0_4_ = 0;
  local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal._4_4_ = 0;
  local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  if (local_218->_vptr_Operation == (_func_int **)0x0) {
    local_218[2]._vptr_Operation = (_func_int **)pVVar9;
    local_218[3]._vptr_Operation = (_func_int **)pVVar10;
    local_218->_vptr_Operation = (_func_int **)HVar7.m_internal;
    local_218[1]._vptr_Operation = (_func_int **)pDVar8;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)17>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)17>_> *)(pOVar15 + 10),
               (VkRenderPass)local_218->_vptr_Operation);
    local_218[2]._vptr_Operation =
         (_func_int **)
         local_1b8.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.
         deleter.m_deviceIface;
    local_218[3]._vptr_Operation =
         (_func_int **)
         local_1b8.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.
         deleter.m_device;
    local_218->_vptr_Operation = (_func_int **)local_1b8.m_renderSize.m_data;
    local_218[1]._vptr_Operation =
         (_func_int **)
         local_1b8.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object
         .m_internal;
    if (local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)17>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)17>_> *)
                 &local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter,
                 (VkRenderPass)
                 local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal);
    }
  }
  makeFramebuffer((Move<vk::Handle<(vk::HandleType)23>_> *)&local_268,pDVar3,pVVar4,
                  (VkRenderPass)pOVar15[9]._vptr_Operation,
                  (VkImageView)pOVar15[0x1c]._vptr_Operation,
                  *(deUint32 *)&pOVar15[0x20]._vptr_Operation,
                  *(deUint32 *)((long)&pOVar15[0x20]._vptr_Operation + 4),1);
  pVVar10 = local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator;
  pVVar9 = local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device;
  pDVar8 = local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface;
  HVar7.m_internal =
       local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal;
  local_1b8.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
  m_deviceIface =
       (DeviceInterface *)
       local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device;
  local_1b8.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
  m_device = (VkDevice)
             local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator;
  local_1b8.m_renderSize.m_data[0] =
       (undefined4)local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal
  ;
  local_1b8.m_renderSize.m_data[1] =
       local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal._4_4_;
  local_1b8.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
  m_internal = (deUint64)
               local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface
  ;
  local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal._0_4_ = 0;
  local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal._4_4_ = 0;
  local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  if (local_208->_vptr_Operation == (_func_int **)0x0) {
    local_208[2]._vptr_Operation = (_func_int **)pVVar9;
    local_208[3]._vptr_Operation = (_func_int **)pVVar10;
    local_208->_vptr_Operation = (_func_int **)HVar7.m_internal;
    local_208[1]._vptr_Operation = (_func_int **)pDVar8;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)23>_> *)(pOVar15 + 0xe),
               (VkFramebuffer)local_208->_vptr_Operation);
    local_208[2]._vptr_Operation =
         (_func_int **)
         local_1b8.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.
         deleter.m_deviceIface;
    local_208[3]._vptr_Operation =
         (_func_int **)
         local_1b8.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.
         deleter.m_device;
    local_208->_vptr_Operation = (_func_int **)local_1b8.m_renderSize.m_data;
    local_208[1]._vptr_Operation =
         (_func_int **)
         local_1b8.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object
         .m_internal;
    if (local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)23>_> *)
                 &local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter,
                 (VkFramebuffer)
                 local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal);
    }
  }
  makePipelineLayout((Move<vk::Handle<(vk::HandleType)16>_> *)&local_268,pDVar3,pVVar4,
                     (VkDescriptorSetLayout)local_228->_vptr_Operation);
  pVVar10 = local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator;
  pVVar9 = local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device;
  pDVar8 = local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface;
  HVar7.m_internal =
       local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal;
  local_1b8.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
  m_deviceIface =
       (DeviceInterface *)
       local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device;
  local_1b8.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
  m_device = (VkDevice)
             local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator;
  local_1b8.m_renderSize.m_data[0] =
       (undefined4)local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal
  ;
  local_1b8.m_renderSize.m_data[1] =
       local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal._4_4_;
  local_1b8.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
  m_internal = (deUint64)
               local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface
  ;
  local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal = 0;
  local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  if (local_220->_vptr_Operation == (_func_int **)0x0) {
    local_220[2]._vptr_Operation = (_func_int **)pVVar9;
    local_220[3]._vptr_Operation = (_func_int **)pVVar10;
    local_220->_vptr_Operation = (_func_int **)HVar7.m_internal;
    local_220[1]._vptr_Operation = (_func_int **)pDVar8;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)16>_> *)(pOVar15 + 0x12),
               (VkPipelineLayout)local_220->_vptr_Operation);
    local_220[2]._vptr_Operation =
         (_func_int **)
         local_1b8.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.
         deleter.m_deviceIface;
    local_220[3]._vptr_Operation =
         (_func_int **)
         local_1b8.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.
         deleter.m_device;
    local_220->_vptr_Operation = (_func_int **)local_1b8.m_renderSize.m_data;
    local_220[1]._vptr_Operation =
         (_func_int **)
         local_1b8.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object
         .m_internal;
    if (local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)16>_> *)
                 &local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter,
                 (VkPipelineLayout)
                 local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal);
    }
  }
  memset(&local_1b8.m_vertexShaderModule,0,0xf4);
  local_1b8.m_patchControlPoints = 1;
  local_1b8.m_blendEnable = false;
  local_1b8.m_primitiveTopology = VK_PRIMITIVE_TOPOLOGY_POINT_LIST;
  local_1b8.m_renderSize.m_data[0] = extent->width;
  local_1b8.m_renderSize.m_data[1] = extent->height;
  format = ::vk::mapVkFormat(VK_FORMAT_R32G32B32A32_UINT);
  stride = tcu::getPixelSize(format);
  pGVar16 = GraphicsPipelineBuilder::setVertexInputSingleAttribute
                      (&local_1b8,VK_FORMAT_R32G32B32A32_UINT,stride);
  local_68.field_2._M_allocated_capacity = 0x65765f7475706e69;
  local_68.field_2._8_2_ = 0x7472;
  local_68._M_string_length = 10;
  local_68.field_2._M_local_buf[10] = '\0';
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  cVar17 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
           ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
                   *)local_1f8->m_progCollection,&local_68);
  pGVar16 = GraphicsPipelineBuilder::setShader
                      (pGVar16,pDVar3,pVVar4,VK_SHADER_STAGE_VERTEX_BIT,
                       *(ProgramBinary **)(cVar17._M_node + 2),(VkSpecializationInfo *)0x0);
  local_88.field_2._M_allocated_capacity = 0x72665f7475706e69;
  local_88.field_2._8_2_ = 0x6761;
  local_88._M_string_length = 10;
  local_88.field_2._M_local_buf[10] = '\0';
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  cVar17 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
           ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
                   *)local_1f8->m_progCollection,&local_88);
  pGVar16 = GraphicsPipelineBuilder::setShader
                      (pGVar16,pDVar3,pVVar4,VK_SHADER_STAGE_FRAGMENT_BIT,
                       *(ProgramBinary **)(cVar17._M_node + 2),(VkSpecializationInfo *)0x0);
  GraphicsPipelineBuilder::build
            (&local_248,pGVar16,pDVar3,pVVar4,(VkPipelineLayout)local_220->_vptr_Operation,
             (VkRenderPass)local_218->_vptr_Operation,local_1f8->m_pipelineCacheData);
  pOVar1 = local_1f0;
  pVVar10 = local_248.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator;
  pVVar4 = local_248.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device;
  pDVar3 = local_248.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface;
  HVar11.m_internal =
       local_248.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal;
  local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device =
       local_248.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device;
  local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator =
       local_248.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator;
  local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal =
       local_248.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal;
  local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface =
       local_248.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface;
  local_248.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal = 0;
  local_248.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_248.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_248.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  if (local_1f0->_vptr_Operation == (_func_int **)0x0) {
    local_1f0[2]._vptr_Operation = (_func_int **)pVVar4;
    local_1f0[3]._vptr_Operation = (_func_int **)pVVar10;
    local_1f0->_vptr_Operation = (_func_int **)HVar11.m_internal;
    local_1f0[1]._vptr_Operation = (_func_int **)pDVar3;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)18>_> *)(pOVar15 + 0x16),
               (VkPipeline)local_1f0->_vptr_Operation);
    pOVar1[2]._vptr_Operation =
         (_func_int **)
         local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device;
    pOVar1[3]._vptr_Operation =
         (_func_int **)
         local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator;
    pOVar1->_vptr_Operation =
         (_func_int **)
         local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal;
    pOVar1[1]._vptr_Operation =
         (_func_int **)
         local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface;
    if (local_248.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
                (&local_248.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter,
                 (VkPipeline)
                 local_248.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal);
    }
  }
  local_248.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_248.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  local_248.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal = 0;
  local_248.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  GraphicsPipelineBuilder::~GraphicsPipelineBuilder(&local_1b8);
  (local_1c0->
  super_UniqueBase<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
  ).m_data.ptr = pOVar15;
  return local_1c0;
}

Assistant:

de::MovePtr<Operation> build (OperationContext& context, Resource& resource) const
	{
		return de::MovePtr<Operation>(new Implementation(context, resource));
	}